

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImRect IVar4;
  bool hovered_window_above_modal;
  ImGuiWindow *modal;
  bool is_closed_popup;
  ImGuiWindow *root_window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffcc;
  uint popup_flags;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffdc;
  ImGuiWindow *in_stack_ffffffffffffffe0;
  
  pIVar1 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((GImGui->NavWindow == (ImGuiWindow *)0x0 || ((GImGui->NavWindow->Appearing & 1U) == 0)))) {
    if (((GImGui->IO).MouseClicked[0] & 1U) != 0) {
      pIVar3 = GImGui->HoveredRootWindow;
      popup_flags = 0;
      if ((pIVar3 != (ImGuiWindow *)0x0) &&
         (popup_flags = CONCAT13((char)((uint)in_stack_ffffffffffffffcc >> 0x18),
                                 (uint3)(ushort)in_stack_ffffffffffffffcc),
         (pIVar3->Flags & 0x4000000U) != 0)) {
        bVar2 = IsPopupOpen((ImGuiID)in_stack_ffffffffffffffd0,popup_flags);
        popup_flags = (uint)bVar2 << 0x10 ^ 0xff0000;
      }
      if ((pIVar3 == (ImGuiWindow *)0x0) || ((popup_flags & 0x10000) != 0)) {
        if ((pIVar3 == (ImGuiWindow *)0x0) &&
           ((pIVar1->NavWindow != (ImGuiWindow *)0x0 &&
            (pIVar3 = GetTopMostPopupModal(), pIVar3 == (ImGuiWindow *)0x0)))) {
          FocusWindow(in_stack_ffffffffffffffe0);
        }
      }
      else {
        StartMouseMovingWindow(in_stack_ffffffffffffffd0);
        if ((((pIVar1->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) != 0) &&
           ((pIVar3->Flags & 1U) == 0)) {
          IVar4 = ImGuiWindow::TitleBarRect(in_stack_ffffffffffffffd0);
          in_stack_ffffffffffffffdc = IVar4.Min.x;
          in_stack_ffffffffffffffe0 = IVar4._4_8_;
          bVar2 = ImRect::Contains((ImRect *)&stack0xffffffffffffffdc,(pIVar1->IO).MouseClickedPos);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            pIVar1->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
        if ((pIVar1->HoveredIdDisabled & 1U) != 0) {
          pIVar1->MovingWindow = (ImGuiWindow *)0x0;
        }
      }
    }
    if (((pIVar1->IO).MouseClicked[1] & 1U) != 0) {
      pIVar3 = GetTopMostPopupModal();
      if (pIVar1->HoveredWindow != (ImGuiWindow *)0x0) {
        IsWindowAbove((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      pIVar3);
      }
      ClosePopupsOverWindow
                (in_stack_ffffffffffffffe0,SUB41((uint)in_stack_ffffffffffffffdc >> 0x18,0));
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on empty space to focus window and start moving
    // (after we're done with all our widgets)
    if (g.IO.MouseClicked[0])
    {
        // Handle the edge case of a popup being closed while clicking in its empty space.
        // If we try to focus it, FocusWindow() > ClosePopupsOverWindow() will accidentally close any parent popups because they are not linked together any more.
        ImGuiWindow* root_window = g.HoveredRootWindow;
        const bool is_closed_popup = root_window && (root_window->Flags & ImGuiWindowFlags_Popup) && !IsPopupOpen(root_window->PopupId, ImGuiPopupFlags_AnyPopupLevel);

        if (root_window != NULL && !is_closed_popup)
        {
            StartMouseMovingWindow(g.HoveredWindow); //-V595

            // Cancel moving if clicked outside of title bar
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(root_window->Flags & ImGuiWindowFlags_NoTitleBar))
                if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                    g.MovingWindow = NULL;

            // Cancel moving if clicked over an item which was disabled or inhibited by popups (note that we know HoveredId == 0 already)
            if (g.HoveredIdDisabled)
                g.MovingWindow = NULL;
        }
        else if (root_window == NULL && g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = g.HoveredWindow && IsWindowAbove(g.HoveredWindow, modal);
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}